

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O0

void xmlDocDumpFormatMemoryEnc
               (xmlDocPtr out_doc,xmlChar **doc_txt_ptr,int *doc_txt_len,char *txt_encoding,
               int format)

{
  xmlOutputBufferPtr out;
  size_t sVar1;
  xmlChar *pxVar2;
  xmlCharEncodingHandlerPtr local_e0;
  xmlCharEncodingHandlerPtr conv_hdlr;
  xmlOutputBufferPtr out_buff;
  undefined1 local_c8 [4];
  int dummy;
  xmlSaveCtxt ctxt;
  xmlChar *pxStack_28;
  int format_local;
  char *txt_encoding_local;
  int *doc_txt_len_local;
  xmlChar **doc_txt_ptr_local;
  xmlDocPtr out_doc_local;
  
  out_buff._4_4_ = 0;
  local_e0 = (xmlCharEncodingHandlerPtr)0x0;
  txt_encoding_local = (char *)doc_txt_len;
  if (doc_txt_len == (int *)0x0) {
    txt_encoding_local = (char *)((long)&out_buff + 4);
  }
  if (doc_txt_ptr == (xmlChar **)0x0) {
    txt_encoding_local[0] = '\0';
    txt_encoding_local[1] = '\0';
    txt_encoding_local[2] = '\0';
    txt_encoding_local[3] = '\0';
  }
  else {
    *doc_txt_ptr = (xmlChar *)0x0;
    ctxt.escapeAttr._4_4_ = format;
    txt_encoding_local[0] = '\0';
    txt_encoding_local[1] = '\0';
    txt_encoding_local[2] = '\0';
    txt_encoding_local[3] = '\0';
    if (out_doc != (xmlDocPtr)0x0) {
      pxStack_28 = (xmlChar *)txt_encoding;
      if (txt_encoding == (char *)0x0) {
        pxStack_28 = out_doc->encoding;
      }
      if ((pxStack_28 == (xmlChar *)0x0) ||
         (local_e0 = xmlFindCharEncodingHandler((char *)pxStack_28),
         local_e0 != (xmlCharEncodingHandlerPtr)0x0)) {
        out = xmlAllocOutputBuffer(local_e0);
        if (out == (xmlOutputBufferPtr)0x0) {
          xmlSaveErrMemory("creating buffer");
        }
        else {
          memset(local_c8,0,0x98);
          ctxt.buf._4_4_ = 0;
          ctxt.options = (int)(ctxt.escapeAttr._4_4_ != 0);
          ctxt.filename = pxStack_28;
          ctxt.handler = (xmlCharEncodingHandlerPtr)out;
          xmlSaveCtxtInit((xmlSaveCtxtPtr)local_c8);
          ctxt.buf._0_4_ = (uint)ctxt.buf | 0x20;
          xmlDocContentDumpOutput((xmlSaveCtxtPtr)local_c8,out_doc);
          xmlOutputBufferFlush(out);
          if (out->conv == (xmlBufPtr)0x0) {
            sVar1 = xmlBufUse(out->buffer);
            *(int *)txt_encoding_local = (int)sVar1;
            pxVar2 = xmlBufContent(out->buffer);
            pxVar2 = xmlStrndup(pxVar2,*(int *)txt_encoding_local);
            *doc_txt_ptr = pxVar2;
          }
          else {
            sVar1 = xmlBufUse(out->conv);
            *(int *)txt_encoding_local = (int)sVar1;
            pxVar2 = xmlBufContent(out->conv);
            pxVar2 = xmlStrndup(pxVar2,*(int *)txt_encoding_local);
            *doc_txt_ptr = pxVar2;
          }
          xmlOutputBufferClose(out);
          if ((*doc_txt_ptr == (xmlChar *)0x0) && (0 < *(int *)txt_encoding_local)) {
            txt_encoding_local[0] = '\0';
            txt_encoding_local[1] = '\0';
            txt_encoding_local[2] = '\0';
            txt_encoding_local[3] = '\0';
            xmlSaveErrMemory("creating output");
          }
        }
      }
      else {
        xmlSaveErr(0x57b,(xmlNodePtr)out_doc,(char *)pxStack_28);
      }
    }
  }
  return;
}

Assistant:

void
xmlDocDumpFormatMemoryEnc(xmlDocPtr out_doc, xmlChar **doc_txt_ptr,
		int * doc_txt_len, const char * txt_encoding,
		int format) {
    xmlSaveCtxt ctxt;
    int                         dummy = 0;
    xmlOutputBufferPtr          out_buff = NULL;
    xmlCharEncodingHandlerPtr   conv_hdlr = NULL;

    if (doc_txt_len == NULL) {
        doc_txt_len = &dummy;   /*  Continue, caller just won't get length */
    }

    if (doc_txt_ptr == NULL) {
        *doc_txt_len = 0;
        return;
    }

    *doc_txt_ptr = NULL;
    *doc_txt_len = 0;

    if (out_doc == NULL) {
        /*  No document, no output  */
        return;
    }

    /*
     *  Validate the encoding value, if provided.
     *  This logic is copied from xmlSaveFileEnc.
     */

    if (txt_encoding == NULL)
	txt_encoding = (const char *) out_doc->encoding;
    if (txt_encoding != NULL) {
	conv_hdlr = xmlFindCharEncodingHandler(txt_encoding);
	if ( conv_hdlr == NULL ) {
	    xmlSaveErr(XML_SAVE_UNKNOWN_ENCODING, (xmlNodePtr) out_doc,
		       txt_encoding);
	    return;
	}
    }

    if ((out_buff = xmlAllocOutputBuffer(conv_hdlr)) == NULL ) {
        xmlSaveErrMemory("creating buffer");
        return;
    }

    memset(&ctxt, 0, sizeof(ctxt));
    ctxt.buf = out_buff;
    ctxt.level = 0;
    ctxt.format = format ? 1 : 0;
    ctxt.encoding = (const xmlChar *) txt_encoding;
    xmlSaveCtxtInit(&ctxt);
    ctxt.options |= XML_SAVE_AS_XML;
    xmlDocContentDumpOutput(&ctxt, out_doc);
    xmlOutputBufferFlush(out_buff);
    if (out_buff->conv != NULL) {
	*doc_txt_len = xmlBufUse(out_buff->conv);
	*doc_txt_ptr = xmlStrndup(xmlBufContent(out_buff->conv), *doc_txt_len);
    } else {
	*doc_txt_len = xmlBufUse(out_buff->buffer);
	*doc_txt_ptr = xmlStrndup(xmlBufContent(out_buff->buffer),*doc_txt_len);
    }
    (void)xmlOutputBufferClose(out_buff);

    if ((*doc_txt_ptr == NULL) && (*doc_txt_len > 0)) {
        *doc_txt_len = 0;
        xmlSaveErrMemory("creating output");
    }

    return;
}